

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Node.hpp
# Opt level: O2

void __thiscall
CX3DImporter_NodeElement_Geometry3D::CX3DImporter_NodeElement_Geometry3D
          (CX3DImporter_NodeElement_Geometry3D *this,EType pType,CX3DImporter_NodeElement *pParent)

{
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar1;
  
  (this->super_CX3DImporter_NodeElement).Type = pType;
  (this->super_CX3DImporter_NodeElement).ID._M_dataplus._M_p =
       (pointer)&(this->super_CX3DImporter_NodeElement).ID.field_2;
  (this->super_CX3DImporter_NodeElement).ID._M_string_length = 0;
  (this->super_CX3DImporter_NodeElement).ID.field_2._M_local_buf[0] = '\0';
  (this->super_CX3DImporter_NodeElement).Parent = pParent;
  plVar1 = &(this->super_CX3DImporter_NodeElement).Child;
  (this->super_CX3DImporter_NodeElement).Child.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->super_CX3DImporter_NodeElement).Child.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->super_CX3DImporter_NodeElement).Child.
  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->super_CX3DImporter_NodeElement)._vptr_CX3DImporter_NodeElement =
       (_func_int **)&PTR__CX3DImporter_NodeElement_Geometry3D_00875050;
  (this->Vertices).super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->Vertices;
  (this->Vertices).super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->Vertices;
  (this->Vertices).super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  _M_node._M_size = 0;
  this->NumIndices = 0;
  this->Solid = true;
  return;
}

Assistant:

CX3DImporter_NodeElement(const EType pType, CX3DImporter_NodeElement* pParent)
		: Type(pType), Parent(pParent)
	{}